

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O0

void uv__async_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  QUEUE *papvVar1;
  QUEUE *papvVar2;
  int iVar3;
  ssize_t sVar4;
  int *piVar5;
  QUEUE *q_1;
  uv_async_t *h;
  QUEUE *q;
  QUEUE queue;
  ssize_t r;
  char buf [1024];
  uint events_local;
  uv__io_t *w_local;
  uv_loop_t *loop_local;
  
  if (w != &loop->async_io_watcher) {
    __assert_fail("w == &loop->async_io_watcher",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/async.c"
                  ,0x54,"void uv__async_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  while( true ) {
    do {
      sVar4 = read(w->fd,&r,0x400);
    } while (sVar4 == 0x400);
    if (((sVar4 != -1) || (piVar5 = __errno_location(), *piVar5 == 0xb)) ||
       (piVar5 = __errno_location(), *piVar5 == 0xb)) break;
    piVar5 = __errno_location();
    if (*piVar5 != 4) {
      abort();
    }
  }
  if (loop->async_handles == (void **)loop->async_handles[0]) {
    q = (QUEUE *)&q;
    queue[0] = &q;
  }
  else {
    q = (QUEUE *)loop->async_handles[0];
    queue[0] = loop->async_handles[1];
    *(QUEUE ***)queue[0] = &q;
    loop->async_handles[1] = (*q)[1];
    *(void ***)loop->async_handles[1] = loop->async_handles;
    (*q)[1] = &q;
  }
  while (papvVar2 = q, (QUEUE *)&q != q) {
    papvVar1 = q + -7;
    *(void **)(*q)[1] = (*q)[0];
    *(void **)((long)(*q)[0] + 8) = (*q)[1];
    (*q)[0] = loop->async_handles;
    (*papvVar2)[1] = loop->async_handles[1];
    *(QUEUE **)(*papvVar2)[1] = papvVar2;
    loop->async_handles[1] = papvVar2;
    iVar3 = cmpxchgi((int *)(papvVar2 + 1),1,0);
    if ((iVar3 != 0) && (papvVar2[-1][1] != (void *)0x0)) {
      (*(code *)papvVar2[-1][1])(*papvVar1 + 1);
    }
  }
  return;
}

Assistant:

static void uv__async_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  char buf[1024];
  ssize_t r;
  QUEUE queue;
  QUEUE* q;
  uv_async_t* h;

  assert(w == &loop->async_io_watcher);

  for (;;) {
    r = read(w->fd, buf, sizeof(buf));

    if (r == sizeof(buf))
      continue;

    if (r != -1)
      break;

    if (errno == EAGAIN || errno == EWOULDBLOCK)
      break;

    if (errno == EINTR)
      continue;

    abort();
  }

  QUEUE_MOVE(&loop->async_handles, &queue);
  while (!QUEUE_EMPTY(&queue)) {
    q = QUEUE_HEAD(&queue);
    h = QUEUE_DATA(q, uv_async_t, queue);

    QUEUE_REMOVE(q);
    QUEUE_INSERT_TAIL(&loop->async_handles, q);

    if (cmpxchgi(&h->pending, 1, 0) == 0)
      continue;

    if (h->async_cb == NULL)
      continue;

    h->async_cb(h);
  }
}